

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dequantize.cpp
# Opt level: O0

int __thiscall ncnn::Dequantize::load_model(Dequantize *this,ModelBin *mb)

{
  bool bVar1;
  long *in_RSI;
  Mat *in_RDI;
  undefined8 in_R8;
  undefined8 in_R9;
  Mat *in_stack_ffffffffffffff98;
  undefined1 local_58 [88];
  
  if (*(int *)((long)&in_RDI[2].cstep + 4) != 0) {
    (**(code **)(*in_RSI + 0x10))
              (local_58,in_RSI,*(undefined4 *)&in_RDI[3].data,1,in_R8,in_R9,local_58);
    Mat::operator=(in_stack_ffffffffffffff98,in_RDI);
    Mat::~Mat((Mat *)0x1ad80d);
    bVar1 = Mat::empty(in_RDI);
    if (bVar1) {
      return -100;
    }
  }
  return 0;
}

Assistant:

int Dequantize::load_model(const ModelBin& mb)
{
    if (bias_term)
    {
        bias_data = mb.load(bias_data_size, 1);
        if (bias_data.empty())
            return -100;
    }

    return 0;
}